

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

unsigned_long ndiGetBXFrame(ndicapi *pol,int portHandle)

{
  uint local_20;
  int n;
  int i;
  int portHandle_local;
  ndicapi *pol_local;
  
  local_20 = 0;
  while (((int)local_20 < (int)(uint)pol->BxHandleCount &&
         (pol->BxHandles[(int)local_20] != portHandle))) {
    local_20 = local_20 + 1;
  }
  if (local_20 == pol->BxHandleCount) {
    pol_local = (ndicapi *)0x0;
  }
  else {
    pol_local = (ndicapi *)(ulong)pol->BxFrameNumber[(int)local_20];
  }
  return (unsigned_long)pol_local;
}

Assistant:

ndicapiExport unsigned long ndiGetBXFrame(ndicapi* pol, int portHandle)
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  return pol->BxFrameNumber[i];
}